

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O0

void Ver_StreamSkipToChars(Ver_Stream_t *p,char *pCharsToStop)

{
  char *local_28;
  char *pTemp;
  char *pChar;
  char *pCharsToStop_local;
  Ver_Stream_t *p_local;
  
  if (p->fStop != 0) {
    __assert_fail("!p->fStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x160,"void Ver_StreamSkipToChars(Ver_Stream_t *, char *)");
  }
  if (pCharsToStop != (char *)0x0) {
    if (p->pBufferStop < p->pBufferCur) {
      Ver_StreamReload(p);
    }
    pTemp = p->pBufferCur;
    while( true ) {
      local_28 = pCharsToStop;
      if (p->pBufferEnd <= pTemp) {
        if (p->pBufferStop == p->pBufferEnd) {
          p->fStop = 1;
        }
        else {
          printf("Ver_StreamSkipToSymbol() failed to parse the file \"%s\".\n",p->pFileName);
        }
        return;
      }
      for (; (*local_28 != '\0' && (*pTemp != *local_28)); local_28 = local_28 + 1) {
      }
      if (*local_28 != '\0') break;
      if (*pTemp == '\n') {
        p->nLineCounter = p->nLineCounter + 1;
      }
      pTemp = pTemp + 1;
    }
    p->pBufferCur = pTemp;
    return;
  }
  __assert_fail("pCharsToStop != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                ,0x161,"void Ver_StreamSkipToChars(Ver_Stream_t *, char *)");
}

Assistant:

void Ver_StreamSkipToChars( Ver_Stream_t * p, char * pCharsToStop )
{
    char * pChar, * pTemp;
    assert( !p->fStop );
    assert( pCharsToStop != NULL );
    // check if the new data should to be loaded
    if ( p->pBufferCur > p->pBufferStop )
        Ver_StreamReload( p );
    // skip the symbols
    for ( pChar = p->pBufferCur; pChar < p->pBufferEnd; pChar++ )
    {
        // skip symbols as long as they are NOT in the list
        for ( pTemp = pCharsToStop; *pTemp; pTemp++ )
            if ( *pChar == *pTemp )
                break;
        if ( *pTemp == 0 ) // pChar is not found in the list
        {
            // count the lines
            if ( *pChar == '\n' )
                p->nLineCounter++;
            continue;
        }
        // the symbol is found - move position and return
        p->pBufferCur = pChar;
        return;
    }
    // the file is finished or the last part continued 
    // through VER_OFFSET_SIZE chars till the end of the buffer
    if ( p->pBufferStop == p->pBufferEnd ) // end of file
    {
        p->fStop = 1;
        return;
    }
    printf( "Ver_StreamSkipToSymbol() failed to parse the file \"%s\".\n", p->pFileName );
}